

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O1

void __thiscall
raspicam::_private::Private_Impl_Still::setRotation(Private_Impl_Still *this,int rotation)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  if (0 < rotation) {
    iVar2 = rotation;
  }
  uVar1 = ((uint)((iVar2 + (rotation >> 0x1f)) - rotation) / 0x168 - (rotation >> 0x1f)) * 0x168 +
          rotation;
  uVar3 = uVar1 % 0x168;
  if ((int)uVar1 < 0x168) {
    uVar3 = uVar1;
  }
  this->rotation = uVar3;
  this->changedSettings = true;
  return;
}

Assistant:

void Private_Impl_Still::setRotation ( int rotation ) {
            while ( rotation < 0 )
                rotation += 360;
            if ( rotation >= 360 )
                rotation = rotation % 360;
            this->rotation = rotation;
            changedSettings = true;
        }